

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::BranchIf::visitExpressions(BranchIf *this,ExpressionVisitorFn fn)

{
  Expression *pEVar1;
  pool_ref<soul::heart::Expression> local_68;
  pool_ref<soul::heart::Expression> arg_1;
  pool_ref<soul::heart::Expression> *__end2_1;
  pool_ref<soul::heart::Expression> *__begin2_1;
  ArgListType *__range2_1;
  pool_ref<soul::heart::Expression> local_38;
  pool_ref<soul::heart::Expression> arg;
  pool_ref<soul::heart::Expression> *__end2;
  pool_ref<soul::heart::Expression> *__begin2;
  ArgListType *__range2;
  ExpressionVisitorFn fn_local;
  BranchIf *this_local;
  
  pEVar1 = pool_ref<soul::heart::Expression>::operator->(&this->condition);
  (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
  std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
            (fn,&this->condition,read);
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::begin
                     (this->targetArgs);
  arg.object = (Expression *)
               ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::end
                         (this->targetArgs);
  for (; (Expression *)__end2 != arg.object; __end2 = __end2 + 1) {
    local_38 = (pool_ref<soul::heart::Expression>)__end2->object;
    pEVar1 = pool_ref<soul::heart::Expression>::operator->(&local_38);
    (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
    std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
              (fn,&local_38,read);
    pool_ref<soul::heart::Expression>::~pool_ref(&local_38);
  }
  __end2_1 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::begin
                       (this->targetArgs + 1);
  arg_1.object = (Expression *)
                 ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::end
                           (this->targetArgs + 1);
  for (; (Expression *)__end2_1 != arg_1.object; __end2_1 = __end2_1 + 1) {
    local_68 = (pool_ref<soul::heart::Expression>)__end2_1->object;
    pEVar1 = pool_ref<soul::heart::Expression>::operator->(&local_68);
    (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
    std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
              (fn,&local_68,read);
    pool_ref<soul::heart::Expression>::~pool_ref(&local_68);
  }
  return;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn) override
        {
            condition->visitExpressions (fn, AccessType::read);
            fn (condition, AccessType::read);

            for (auto arg : targetArgs[0])
            {
                arg->visitExpressions (fn, AccessType::read);
                fn (arg, AccessType::read);
            }

            for (auto arg : targetArgs[1])
            {
                arg->visitExpressions (fn, AccessType::read);
                fn (arg, AccessType::read);
            }

        }